

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort_wrapper.hpp
# Opt level: O2

bool dss::check<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      end,vector<unsigned_long,_std::allocator<unsigned_long>_> *SA)

{
  pointer puVar1;
  int iVar2;
  long lVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  
  lVar3 = (long)end._M_current - (long)begin._M_current;
  puVar1 = (SA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(SA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 >> 3 == lVar3) {
    iVar2 = sufcheck64(begin._M_current,puVar1,lVar3,1,in_R8,in_R9,lVar3);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

bool check(InputIterator begin, InputIterator end, const std::vector<T>& SA)
{
    typedef typename std::iterator_traits<InputIterator>::value_type char_t;
    if (sizeof(char_t) != 1)
        throw std::runtime_error("Input must be a char type");
    std::size_t n = std::distance(begin, end);
    if (SA.size() != n)
        return false;
    if (sizeof(T) == sizeof(saidx_t)) {
        if (n >= std::numeric_limits<saidx_t>::max())
            throw std::runtime_error("Input size is too large for 32bit indexing.");
        return sufcheck(reinterpret_cast<const sauchar_t*>(&(*begin)),
                        reinterpret_cast<const saidx_t*>(&SA[0]), n, 1) == 0;
    } else if (sizeof(T) == sizeof(saidx64_t)) {
        return sufcheck64(reinterpret_cast<const sauchar_t*>(&(*begin)),
                          reinterpret_cast<const saidx64_t*>(&SA[0]), n, 1) == 0;
    } else {
        throw std::runtime_error("Unsupported datatype of Suffix Array.");
    }
}